

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

spv_result_t
spvBinaryParse(spv_const_context context,void *user_data,uint32_t *code,size_t num_words,
              spv_parsed_header_fn_t parsed_header,spv_parsed_instruction_fn_t parsed_instruction,
              spv_diagnostic *diagnostic)

{
  uint32_t *puVar1;
  uint32_t type_id;
  mapped_type mVar2;
  _Manager_type p_Var3;
  __node_base_ptr p_Var4;
  __node_ptr p_Var5;
  undefined2 uVar6;
  undefined4 endian;
  bool bVar7;
  spv_result_t sVar8;
  spv_operand_type_t sVar9;
  spv_operand_type_t sVar10;
  spv_operand_type_t opcode;
  spv_ext_inst_type_t sVar11;
  int32_t iVar12;
  uint32_t uVar13;
  DiagnosticStream *pDVar14;
  undefined8 uVar15;
  uint *puVar16;
  mapped_type *pmVar17;
  _Hash_node_base *p_Var18;
  __node_base_ptr p_Var19;
  mapped_type *pmVar20;
  __node_ptr p_Var21;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var22;
  uint uVar23;
  __hash_code __c;
  __node_base _Var24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  size_type __n;
  ulong uVar28;
  ushort uVar29;
  uint uVar30;
  int iVar31;
  uint32_t *inst_offset;
  Op OVar32;
  char *pcVar33;
  spv_parsed_instruction_fn_t p_Var34;
  __node_base_ptr p_Var35;
  uint *puVar36;
  char cVar37;
  long lVar38;
  byte bVar39;
  undefined1 auVar40 [16];
  uint16_t inst_word_count;
  spv_operand_desc entry;
  spv_parsed_instruction_t inst;
  spv_opcode_desc opcode_desc;
  uint32_t first_word;
  Parser parser;
  spv_context_t hijack_context;
  spv_header_t header;
  spv_const_binary_t binary;
  spv_operand_desc entry_2;
  uint16_t local_4a2;
  uint32_t *local_4a0;
  Op local_494;
  ulong local_490;
  uint local_484;
  spv_parsed_operand_t local_480;
  ulong local_470;
  spv_ext_inst_desc local_468;
  ulong local_460;
  undefined1 local_458 [24];
  ushort uStack_440;
  undefined2 uStack_43e;
  spv_ext_inst_type_t sStack_43c;
  undefined8 local_438;
  spv_parsed_operand_t *psStack_430;
  undefined8 local_428 [2];
  size_t local_418;
  spv_opcode_desc local_410;
  char *local_408;
  spv_operand_type_t local_3fc;
  uint *local_3f8;
  undefined1 local_3f0 [112];
  __buckets_ptr local_380;
  ulong local_378;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_348;
  __buckets_ptr local_310;
  ulong local_308;
  spv_parsed_operand_t *local_2d8;
  iterator local_2d0;
  spv_parsed_operand_t *local_2c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2c0;
  spv_operand_pattern_t local_2a8;
  long local_290;
  uint32_t *local_288;
  uint *local_280;
  spv_context_t local_278;
  spv_header_t local_238;
  spv_const_binary_t local_218;
  DiagnosticStream local_208;
  
  local_278.target_env = context->target_env;
  local_278._4_4_ = *(undefined4 *)&context->field_0x4;
  local_278.opcode_table = context->opcode_table;
  local_278.operand_table = context->operand_table;
  local_278.ext_inst_table = context->ext_inst_table;
  local_278.consumer.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_278.consumer.super__Function_base._M_functor._8_8_ = 0;
  local_278.consumer.super__Function_base._M_manager = (_Manager_type)0x0;
  local_278.consumer._M_invoker = (_Invoker_type)0x0;
  p_Var3 = (context->consumer).super__Function_base._M_manager;
  local_4a0 = code;
  local_418 = num_words;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&local_278.consumer,(_Any_data *)&context->consumer,__clone_functor);
    local_278.consumer._M_invoker = (context->consumer)._M_invoker;
    local_278.consumer.super__Function_base._M_manager =
         (context->consumer).super__Function_base._M_manager;
  }
  if (diagnostic != (spv_diagnostic *)0x0) {
    *diagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&local_278,diagnostic);
  }
  local_3f0._0_4_ = local_278.target_env;
  local_3f0._8_8_ = local_278.operand_table;
  local_3f0._16_8_ = local_278.opcode_table;
  local_3f0._24_8_ = local_278.ext_inst_table;
  local_3f0._32_8_ = &local_278.consumer;
  local_3f0._40_8_ = user_data;
  local_3f0._48_8_ = parsed_header;
  local_3f0._56_8_ = parsed_instruction;
  anon_unknown.dwarf_620068::Parser::State::State
            ((State *)(local_3f0 + 0x40),(uint32_t *)0x0,0,(spv_diagnostic *)0x0);
  anon_unknown.dwarf_620068::Parser::State::State
            ((State *)&local_208,local_4a0,local_418,diagnostic);
  anon_unknown.dwarf_620068::Parser::State::operator=
            ((State *)(local_3f0 + 0x40),(State *)&local_208);
  anon_unknown.dwarf_620068::Parser::State::~State((State *)&local_208);
  if ((uint32_t *)local_3f0._64_8_ == (uint32_t *)0x0) {
    anon_unknown.dwarf_620068::Parser::diagnostic
              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
    pcVar33 = "Missing module.";
    lVar25 = 0xf;
LAB_00207648:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar33,lVar25);
  }
  else {
    if ((uint32_t *)0x4 < (ulong)local_3f0._72_8_) {
      local_218.code = (uint32_t *)local_3f0._64_8_;
      local_218.wordCount = local_3f0._72_8_;
      sVar8 = spvBinaryEndianness(&local_218,(spv_endianness_t *)(local_3f0 + 0x68));
      if (sVar8 == SPV_SUCCESS) {
        bVar7 = spvIsHostEndian(local_3f0._104_4_);
        local_3f0[0x6c] = !bVar7;
        sVar8 = spvBinaryHeaderGet(&local_218,local_3f0._104_4_,&local_238);
        if (sVar8 == SPV_SUCCESS) {
          if ((spv_parsed_header_fn_t)local_3f0._48_8_ == (spv_parsed_header_fn_t)0x0) {
LAB_002077f1:
            local_3f0._88_8_ = (uint32_t *)0x5;
LAB_00207811:
            if ((ulong)local_3f0._88_8_ < (ulong)local_3f0._72_8_) {
              local_3f0._96_8_ = local_3f0._96_8_ + 1;
              local_438 = 0;
              psStack_430 = (spv_parsed_operand_t *)0x0;
              local_458._16_8_ = (Capability *)0x0;
              _uStack_440 = SPV_OPERAND_TYPE_NONE;
              sStack_43c = SPV_OPERAND_TYPE_NONE;
              local_428[0]._0_4_ = SPV_OPERAND_TYPE_NONE;
              local_428[0]._4_4_ = SPV_OPERAND_TYPE_NONE;
              local_3fc = anon_unknown.dwarf_620068::Parser::peekAt
                                    ((Parser *)local_3f0,local_3f0._88_8_);
              if (local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              }
              if (local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2c0,
                           (iterator)
                           local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_3fc);
              }
              else {
                *local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_3fc;
                local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              if (local_2d0._M_current != local_2d8) {
                local_2d0._M_current = local_2d8;
              }
              if ((ulong)local_3f0._72_8_ <= (ulong)local_3f0._88_8_) {
                __assert_fail("_.word_index < _.num_words",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                              ,0x138,
                              "spv_result_t (anonymous namespace)::Parser::parseInstruction()");
              }
              local_4a2 = 0;
              spvOpcodeSplit(local_3fc,&local_4a2,&uStack_43e);
              if (local_4a2 == 0) {
                anon_unknown.dwarf_620068::Parser::diagnostic
                          (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Invalid instruction word count: ",0x20);
LAB_00207982:
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                sVar9 = local_208.error_;
LAB_00207994:
                user_data = (void *)(ulong)sVar9;
                spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
              }
              else {
                sVar8 = spvtools::AssemblyGrammar::lookupOpcode
                                  ((AssemblyGrammar *)local_3f0,(uint)(ushort)uStack_43e,&local_410)
                ;
                if (sVar8 != SPV_SUCCESS) {
                  anon_unknown.dwarf_620068::Parser::diagnostic
                            (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Invalid opcode: ",0x10);
                  goto LAB_00207982;
                }
                local_4a0 = (uint32_t *)local_3f0._88_8_;
                local_3f0._88_8_ = local_3f0._88_8_ + 1;
                if (local_2a8.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_2a8.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  local_2a8.
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_2a8.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                }
                uVar23 = (uint)local_410->numTypes;
                local_288 = (uint32_t *)local_3f0._88_8_;
                if (local_410->numTypes != 0) {
                  uVar30 = 0;
                  user_data = (spv_parsed_instruction_fn_t)0xffffffff;
                  do {
                    if (local_2a8.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_2a8.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
                      _M_realloc_insert<spv_operand_type_t_const&>
                                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)
                                 &local_2a8,
                                 (iterator)
                                 local_2a8.
                                 super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 local_410->operandTypes + (int)(uVar23 + (int)user_data));
                    }
                    else {
                      *local_2a8.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           local_410->operandTypes[(int)(uVar23 + (int)user_data)];
                      local_2a8.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_2a8.
                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    uVar30 = uVar30 + 1;
                    uVar23 = (uint)local_410->numTypes;
                    user_data = (void *)(ulong)((int)user_data - 1);
                  } while (uVar30 < uVar23);
                }
                local_484 = (uint)parsed_instruction;
                inst_offset = local_4a0;
                do {
                  sVar9 = (spv_operand_type_t)user_data;
                  if ((uint32_t *)((ulong)local_4a2 + (long)inst_offset) <= (ulong)local_3f0._88_8_)
                  {
                    if ((local_2a8.
                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         local_2a8.
                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish) ||
                       (bVar7 = spvOperandIsOptional
                                          (local_2a8.
                                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish[-1]), bVar7))
                    {
                      if ((uint32_t *)((long)inst_offset + (ulong)local_4a2) ==
                          (uint32_t *)local_3f0._88_8_) {
                        __c = (long)local_2c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start;
                        local_418 = CONCAT44(local_418._4_4_,sVar9);
                        if ((bool)local_3f0[0x6c] == true) {
                          __c = (long)__c >> 2;
                          if (__c != local_4a2) {
                            __assert_fail("!_.requires_endian_conversion || (inst_word_count == _.endian_converted_words.size())"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                          ,0x180,
                                          "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                         );
                          }
                        }
                        else if (__c != 4) {
                          __assert_fail("_.requires_endian_conversion || (_.endian_converted_words.size() == 1)"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                        ,0x182,
                                        "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                       );
                        }
                        uVar6 = uStack_43e;
                        OVar32 = (Op)(ushort)uStack_43e;
                        iVar12 = spvOpcodeGeneratesType(OVar32);
                        puVar1 = local_4a0;
                        if (iVar12 == 0) goto LAB_0020902e;
                        if (OVar32 == OpTypeFloat) {
                          iVar31 = 3;
LAB_00208e02:
                          uVar13 = anon_unknown.dwarf_620068::Parser::peekAt
                                             ((Parser *)local_3f0,(long)puVar1 + 2);
                        }
                        else {
                          iVar31 = 0;
                          uVar13 = 0;
                          if (uVar6 == 0x15) {
                            uVar13 = anon_unknown.dwarf_620068::Parser::peekAt
                                               ((Parser *)local_3f0,(long)local_4a0 + 3);
                            iVar31 = 2 - (uint)(uVar13 == 0);
                            goto LAB_00208e02;
                          }
                        }
                        uVar26 = local_438 >> 0x20;
                        uVar27 = uVar26 % local_348._M_bucket_count;
                        p_Var21 = std::
                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  ::_M_find_node(&local_348,uVar27,
                                                 (key_type_conflict *)((long)&local_438 + 4),__c);
                        if (p_Var21 != (__node_ptr)0x0) goto LAB_0020901a;
                        p_Var21 = (__node_ptr)operator_new(0x18);
                        (p_Var21->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
                        (p_Var21->
                        super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                        ._M_storage._M_storage.__align = local_438._4_4_;
                        *(undefined8 *)
                         ((long)&(p_Var21->
                                 super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                                 ._M_storage._M_storage + 4) = 0;
                        auVar40 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                            ((ulong)&local_348._M_rehash_policy,
                                             local_348._M_bucket_count,local_348._M_element_count);
                        __n = auVar40._8_8_;
                        if ((auVar40 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                        goto LAB_00208f9d;
                        local_470 = CONCAT44(local_470._4_4_,uVar13);
                        if (__n == 1) {
                          local_348._M_single_bucket = (__node_base_ptr)0x0;
                          __s = &local_348._M_single_bucket;
                        }
                        else {
                          __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                          ((new_allocator<std::__detail::_Hash_node_base_*> *)
                                           &local_208,__n,(void *)0x0);
                          memset(__s,0,__n * 8);
                        }
                        _Var24._M_nxt = local_348._M_before_begin._M_nxt;
                        local_348._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                        if ((__node_ptr)_Var24._M_nxt == (__node_ptr)0x0) goto LAB_00208f58;
                        uVar27 = 0;
                        goto LAB_00208ef4;
                      }
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid word count: Op",0x16);
                      pDVar14 = spvtools::DiagnosticStream::operator<<(&local_208,&local_410->name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar14," starting at word ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar14," says it has ",0xd);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar14," words, but found ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                      lVar25 = 0xf;
                      pcVar33 = " words instead.";
                    }
                    else {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"End of input reached while decoding Op",0x26
                                );
                      pDVar14 = spvtools::DiagnosticStream::operator<<(&local_208,&local_410->name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar14," starting at word ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar14,": expected more operands after ",0x1f);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                      lVar25 = 7;
                      pcVar33 = " words.";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar14,pcVar33,lVar25);
                    sVar9 = pDVar14->error_;
                    goto LAB_00207994;
                  }
                  if (local_2a8.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      local_2a8.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    anon_unknown.dwarf_620068::Parser::diagnostic
                              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Invalid instruction Op",0x16);
                    pDVar14 = spvtools::DiagnosticStream::operator<<(&local_208,&local_410->name);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar14," starting at word ",0x12);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar14,": expected no more operands after ",0x22);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar14," words, but stated word count is ",0x21);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar14,".",1);
                    inst_offset = local_4a0;
                    sVar10 = pDVar14->error_;
                    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    bVar7 = false;
                    goto LAB_00208554;
                  }
                  sVar10 = spvTakeFirstMatchableOperand(&local_2a8);
                  uVar26 = (ulong)sVar10;
                  OVar32 = (Op)(ushort)uStack_43e;
                  local_480.offset = (short)local_3f0._88_8_ - (short)inst_offset;
                  local_480.num_words = 1;
                  local_480.number_kind = SPV_NUMBER_NONE;
                  local_480.number_bit_width = 0;
                  local_418 = CONCAT44(local_418._4_4_,sVar9);
                  local_480.type = sVar10;
                  if ((ulong)local_3f0._72_8_ <= (ulong)local_3f0._88_8_) goto LAB_00207cce;
                  local_494 = (Op)(ushort)uStack_43e;
                  opcode = anon_unknown.dwarf_620068::Parser::peekAt
                                     ((Parser *)local_3f0,local_3f0._88_8_);
                  local_490 = CONCAT44(local_490._4_4_,opcode);
                  local_470 = uVar26;
                  switch(sVar10) {
                  case SPV_OPERAND_TYPE_ID:
                  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
                    if (opcode == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      lVar25 = 7;
                      pcVar33 = "Id is 0";
LAB_002087b7:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,pcVar33,lVar25);
                      sVar9 = local_208.error_;
                      goto LAB_002087cb;
                    }
                    local_480.type = SPV_OPERAND_TYPE_ID;
                    bVar7 = spvIsExtendedInstruction(local_494);
                    if ((!bVar7) || (local_480.offset != 3)) goto LAB_00208423;
                    uVar26 = (local_490 & 0xffffffff) % local_308;
                    p_Var4 = local_310[uVar26];
                    p_Var19 = (__node_base_ptr)0x0;
                    if ((p_Var4 != (__node_base_ptr)0x0) &&
                       (p_Var35 = p_Var4->_M_nxt, p_Var19 = p_Var4,
                       (uint)local_490 != *(uint *)&p_Var35[1]._M_nxt)) {
                      while (p_Var18 = p_Var35->_M_nxt, p_Var18 != (_Hash_node_base *)0x0) {
                        p_Var19 = (__node_base_ptr)0x0;
                        if (((ulong)*(uint *)&p_Var18[1]._M_nxt % local_308 != uVar26) ||
                           (p_Var19 = p_Var35, p_Var35 = p_Var18,
                           (uint)local_490 == *(uint *)&p_Var18[1]._M_nxt)) goto LAB_00208ab4;
                      }
                      p_Var19 = (__node_base_ptr)0x0;
                    }
LAB_00208ab4:
                    if (p_Var19 == (__node_base_ptr)0x0) {
                      p_Var18 = (_Hash_node_base *)0x0;
                    }
                    else {
                      p_Var18 = p_Var19->_M_nxt;
                    }
                    if (p_Var18 == (_Hash_node_base *)0x0) {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"OpExtInst set Id ",0x11);
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,
                                 " does not reference an OpExtInstImport result Id",0x30);
                      sVar9 = local_208.error_;
                      parsed_instruction = (spv_parsed_instruction_fn_t)(ulong)local_484;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    }
                    else {
                      sStack_43c = *(spv_operand_type_t *)((long)&p_Var18[1]._M_nxt + 4);
                    }
                    bVar7 = p_Var18 == (_Hash_node_base *)0x0;
                    goto LAB_00208b30;
                  case SPV_OPERAND_TYPE_TYPE_ID:
                    if (opcode == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      lVar25 = 0x13;
                      pcVar33 = "Error: Type Id is 0";
                      goto LAB_002087b7;
                    }
                    local_438 = CONCAT44(local_438._4_4_,opcode);
                    goto LAB_00208423;
                  case SPV_OPERAND_TYPE_RESULT_ID:
                    if (opcode == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      lVar25 = 0x15;
                      pcVar33 = "Error: Result Id is 0";
                      goto LAB_002087b7;
                    }
                    local_438 = CONCAT44(opcode,(spv_operand_type_t)local_438);
                    p_Var4 = local_380[(ulong)opcode % local_378];
                    p_Var19 = (__node_base_ptr)0x0;
                    if ((p_Var4 != (__node_base_ptr)0x0) &&
                       (p_Var35 = p_Var4->_M_nxt, p_Var19 = p_Var4,
                       opcode != *(spv_operand_type_t *)&p_Var35[1]._M_nxt)) {
                      while (p_Var18 = p_Var35->_M_nxt, p_Var18 != (_Hash_node_base *)0x0) {
                        p_Var19 = (__node_base_ptr)0x0;
                        if (((ulong)*(spv_operand_type_t *)&p_Var18[1]._M_nxt % local_378 !=
                             (ulong)opcode % local_378) ||
                           (p_Var19 = p_Var35, p_Var35 = p_Var18,
                           opcode == *(spv_operand_type_t *)&p_Var18[1]._M_nxt)) goto LAB_00208b42;
                      }
                      p_Var19 = (__node_base_ptr)0x0;
                    }
LAB_00208b42:
                    if ((p_Var19 == (__node_base_ptr)0x0) ||
                       (p_Var19->_M_nxt == (_Hash_node_base *)0x0)) {
                      iVar12 = spvOpcodeGeneratesType(local_494);
                      mVar2 = *(mapped_type *)((long)&local_438 + (ulong)(iVar12 != 0) * 4);
                      pmVar20 = std::__detail::
                                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                              *)&local_380,(key_type *)((long)&local_438 + 4));
                      *pmVar20 = mVar2;
                      inst_offset = local_4a0;
                      goto LAB_00208423;
                    }
                    anon_unknown.dwarf_620068::Parser::diagnostic
                              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Id ",3);
                    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208," is defined more than once",0x1a);
                    sVar9 = local_208.error_;
                    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    inst_offset = local_4a0;
                    break;
                  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
                  case SPV_OPERAND_TYPE_SCOPE_ID:
                    if (opcode == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      local_468 = (spv_ext_inst_desc)
                                  spvOperandTypeStr((spv_operand_type_t)local_470);
                      pDVar14 = spvtools::DiagnosticStream::operator<<
                                          (&local_208,(char **)&local_468);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar14," is 0",5);
                      sVar9 = pDVar14->error_;
                      goto LAB_002087cb;
                    }
                    goto LAB_00208423;
                  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
                    uVar15 = 0x100000006;
                    goto LAB_00208216;
                  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
                    bVar7 = spvIsExtendedInstruction(local_494);
                    if (!bVar7) {
                      __assert_fail("spvIsExtendedInstruction(opcode)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f1,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (sStack_43c == SPV_EXT_INST_TYPE_NONE) {
                      __assert_fail("inst->ext_inst_type != SPV_EXT_INST_TYPE_NONE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f2,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    sVar8 = spvtools::AssemblyGrammar::lookupExtInst
                                      ((AssemblyGrammar *)local_3f0,sStack_43c,(uint)local_490,
                                       &local_468);
                    if (sVar8 == SPV_SUCCESS) {
                      spvPushOperandTypes(local_468->operandTypes,&local_2a8);
LAB_002088bd:
                      bVar7 = true;
                    }
                    else {
                      bVar7 = spvExtInstIsNonSemantic(sStack_43c);
                      if (bVar7) {
                        local_208._0_4_ = 0x34;
                        if (local_2a8.
                            super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish ==
                            local_2a8.
                            super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
                          _M_realloc_insert<spv_operand_type_t>
                                    (&local_2a8,
                                     (iterator)
                                     local_2a8.
                                     super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                                     (spv_operand_type_t *)&local_208);
                        }
                        else {
                          *local_2a8.
                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish =
                               SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE;
                          local_2a8.
                          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               local_2a8.
                               super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        goto LAB_002088bd;
                      }
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid extended instruction number: ",0x25)
                      ;
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      sVar9 = local_208.error_;
                      inst_offset = local_4a0;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      bVar7 = false;
                    }
                    if (bVar7) goto LAB_00208423;
                    break;
                  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
                    if (local_494 != OpSpecConstantOp) {
                      __assert_fail("spv::Op::OpSpecConstantOp == opcode",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x207,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (((int)opcode < 0) ||
                       (sVar8 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode
                                          ((AssemblyGrammar *)local_3f0,opcode),
                       sVar8 != SPV_SUCCESS)) {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_468 = (spv_ext_inst_desc)spvOperandTypeStr(sVar10);
                      pDVar14 = spvtools::DiagnosticStream::operator<<
                                          (&local_208,(char **)&local_468);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar14,": ",2);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                      sVar9 = pDVar14->error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      inst_offset = local_4a0;
                      break;
                    }
                    local_468 = (spv_ext_inst_desc)0x0;
                    sVar10 = spvtools::AssemblyGrammar::lookupOpcode
                                       ((AssemblyGrammar *)local_3f0,opcode,
                                        (spv_opcode_desc *)&local_468);
                    if (sVar10 == SPV_OPERAND_TYPE_NONE) {
                      if (*(byte *)((long)local_468->operandTypes + 0x45) == 0) {
                        __assert_fail("opcode_entry->hasType",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                      ,0x215,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((char)local_468->operandTypes[0x11] == SPV_OPERAND_TYPE_NONE) {
                        __assert_fail("opcode_entry->hasResult",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                      ,0x216,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((ushort)(short)local_468->operandTypes[0] < SPV_OPERAND_TYPE_TYPE_ID) {
                        __assert_fail("opcode_entry->numTypes >= 2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                      ,0x217,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      spvPushOperandTypes(local_468->operandTypes + 3,&local_2a8);
                      inst_offset = local_4a0;
                    }
                    else {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INTERNAL);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"OpSpecConstant opcode table out of sync",
                                 0x27);
                      sVar9 = local_208.error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      inst_offset = local_4a0;
                    }
                    goto joined_r0x0020841d;
                  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
                  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
                    local_480.type = SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER;
                    if ((local_494 == OpConstant) || (local_494 == OpSpecConstant)) {
                      if ((spv_operand_type_t)local_438 == SPV_OPERAND_TYPE_NONE) {
                        __assert_fail("inst->type_id",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                      ,0x24d,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      sVar9 = anon_unknown.dwarf_620068::Parser::setNumericTypeInfoForType
                                        ((Parser *)local_3f0,&local_480,
                                         (spv_operand_type_t)local_438);
                      sVar10 = sVar9;
                      goto joined_r0x0020841d;
                    }
                    if (local_494 != OpSwitch) {
                      __assert_fail("opcode == spv::Op::OpConstant || opcode == spv::Op::OpSpecConstant"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x24a,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    uVar13 = anon_unknown.dwarf_620068::Parser::peekAt
                                       ((Parser *)local_3f0,(size_t)local_288);
                    p_Var4 = local_380[(ulong)uVar13 % local_378];
                    p_Var19 = (__node_base_ptr)0x0;
                    if ((p_Var4 != (__node_base_ptr)0x0) &&
                       (p_Var35 = p_Var4->_M_nxt, p_Var19 = p_Var4,
                       uVar13 != *(uint32_t *)&p_Var35[1]._M_nxt)) {
                      while (p_Var18 = p_Var35->_M_nxt, p_Var18 != (_Hash_node_base *)0x0) {
                        p_Var19 = (__node_base_ptr)0x0;
                        if (((ulong)*(uint *)&p_Var18[1]._M_nxt % local_378 !=
                             (ulong)uVar13 % local_378) ||
                           (p_Var19 = p_Var35, p_Var35 = p_Var18,
                           uVar13 == *(uint *)&p_Var18[1]._M_nxt)) goto LAB_0020897b;
                      }
                      p_Var19 = (__node_base_ptr)0x0;
                    }
LAB_0020897b:
                    if (p_Var19 == (__node_base_ptr)0x0) {
                      p_Var18 = (_Hash_node_base *)0x0;
                    }
                    else {
                      p_Var18 = p_Var19->_M_nxt;
                    }
                    if ((p_Var18 == (_Hash_node_base *)0x0) ||
                       (type_id = *(uint32_t *)((long)&p_Var18[1]._M_nxt + 4), type_id == 0)) {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      lVar25 = 0xc;
                      pcVar33 = " has no type";
LAB_00208a29:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,pcVar33,lVar25);
                      sVar9 = local_208.error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
LAB_00208a3d:
                      bVar7 = false;
                    }
                    else {
                      if (uVar13 == type_id) {
                        anon_unknown.dwarf_620068::Parser::diagnostic
                                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar25 = 0x17;
                        pcVar33 = " is a type, not a value";
                        goto LAB_00208a29;
                      }
                      sVar9 = anon_unknown.dwarf_620068::Parser::setNumericTypeInfoForType
                                        ((Parser *)local_3f0,&local_480,type_id);
                      if (sVar9 != SPV_OPERAND_TYPE_NONE) goto LAB_00208a3d;
                      bVar7 = true;
                      if (local_480.number_kind - SPV_NUMBER_FLOATING < 0xfffffffe) {
                        anon_unknown.dwarf_620068::Parser::diagnostic
                                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar25 = 0x18;
                        pcVar33 = " is not a scalar integer";
                        goto LAB_00208a29;
                      }
                    }
                    bVar7 = !bVar7;
LAB_00208b30:
                    inst_offset = local_4a0;
                    if (!bVar7) goto LAB_00208423;
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
                    uVar15 = 0x30000000a;
LAB_00208216:
                    local_480.type = (spv_operand_type_t)uVar15;
                    local_480.number_kind = (spv_number_kind_t)((ulong)uVar15 >> 0x20);
                    local_480.number_bit_width = 0x20;
LAB_00208423:
                    bVar7 = spvOperandIsConcrete(local_480.type);
                    if (!bVar7) {
                      __assert_fail("spvOperandIsConcrete(parsed_operand.type)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x303,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (local_2d0._M_current == local_2c8) {
                      std::vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>>::
                      _M_realloc_insert<spv_parsed_operand_t_const&>
                                ((vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>>
                                  *)&local_2d8,local_2d0,&local_480);
                    }
                    else {
                      (local_2d0._M_current)->offset = local_480.offset;
                      (local_2d0._M_current)->num_words = local_480.num_words;
                      (local_2d0._M_current)->type = local_480.type;
                      (local_2d0._M_current)->number_kind = local_480.number_kind;
                      (local_2d0._M_current)->number_bit_width = local_480.number_bit_width;
                      local_2d0._M_current = local_2d0._M_current + 1;
                    }
                    endian = local_3f0._104_4_;
                    uVar15 = local_3f0._64_8_;
                    puVar1 = (uint32_t *)(local_3f0._88_8_ + (ulong)local_480.num_words);
                    if ((ulong)local_3f0._72_8_ < puVar1) {
                      sVar10 = (spv_operand_type_t)local_470;
                      OVar32 = local_494;
LAB_00207cce:
                      sVar9 = anon_unknown.dwarf_620068::Parser::exhaustedInputDiagnostic
                                        ((Parser *)local_3f0,(size_t)inst_offset,OVar32,sVar10);
                    }
                    else {
                      if (((bool)local_3f0[0x6c] == true) && ((ulong)local_480.num_words != 0)) {
                        lVar25 = local_3f0._88_8_ * 4;
                        uVar26 = (ulong)local_480.num_words;
                        lVar38 = 0;
                        do {
                          local_208._0_4_ =
                               spvFixWord(*(uint32_t *)(uVar15 + lVar38 + lVar25),endian);
                          if (local_2c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish ==
                              local_2c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                            _M_realloc_insert<unsigned_int>
                                      (&local_2c0,
                                       (iterator)
                                       local_2c0.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,(uint *)&local_208
                                      );
                          }
                          else {
                            *local_2c0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish = local_208._0_4_;
                            local_2c0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 local_2c0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 1;
                          }
                          lVar38 = lVar38 + 4;
                        } while (uVar26 * 4 != lVar38);
                      }
                      sVar9 = SPV_OPERAND_TYPE_NONE;
                      parsed_instruction = (spv_parsed_instruction_fn_t)(ulong)local_484;
                      inst_offset = local_4a0;
                      local_3f0._88_8_ = puVar1;
                    }
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_STRING:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
                    local_468 = (spv_ext_inst_desc)local_458;
                    local_460 = 0;
                    local_458[0] = 0;
                    local_290 = local_3f0._72_8_ - local_3f0._88_8_;
                    bVar39 = local_290 == 0;
                    if (!(bool)bVar39) {
                      local_280 = (uint *)(local_3f0._64_8_ + local_3f0._72_8_ * 4);
                      puVar16 = (uint *)(local_3f0._64_8_ + local_3f0._88_8_ * 4);
                      p_Var34 = (spv_parsed_instruction_fn_t)0x0;
                      local_490 = 0;
                      do {
                        uVar23 = *puVar16;
                        bVar39 = 0;
                        bVar7 = false;
                        puVar36 = (uint *)0x0;
                        local_3f8 = puVar16;
                        do {
                          cVar37 = (char)(uVar23 >> (bVar39 & 0x1f));
                          if (cVar37 == '\0') {
                            local_490 = CONCAT71((int7)((ulong)puVar16 >> 8),1);
                          }
                          else {
                            std::__cxx11::string::push_back((char)&local_468);
                            user_data = p_Var34;
                          }
                          sVar9 = (spv_operand_type_t)user_data;
                          if (cVar37 == '\0') break;
                          bVar7 = (uint *)0x2 < puVar36;
                          puVar16 = (uint *)((long)puVar36 + 1);
                          bVar39 = bVar39 + 8;
                          puVar36 = puVar16;
                        } while (puVar16 != (uint *)0x4);
                        if (!bVar7) break;
                        puVar16 = local_3f8 + 1;
                        p_Var34 = (spv_parsed_instruction_fn_t)(ulong)(puVar16 == local_280);
                      } while (puVar16 != local_280);
                      bVar39 = (byte)p_Var34 | (byte)local_490;
                      parsed_instruction = (spv_parsed_instruction_fn_t)(ulong)local_484;
                      sVar10 = (spv_operand_type_t)local_470;
                      inst_offset = local_4a0;
                    }
                    if (((bVar39 & 1) == 0) && (local_468 != (spv_ext_inst_desc)local_458)) {
                      operator_delete(local_468,CONCAT71(local_458._1_7_,local_458[0]) + 1);
                    }
                    if (local_460 == local_290 << 2) {
                      sVar9 = anon_unknown.dwarf_620068::Parser::exhaustedInputDiagnostic
                                        ((Parser *)local_3f0,(size_t)inst_offset,local_494,sVar10);
                      bVar7 = false;
                    }
                    else {
                      uVar29 = (short)(local_460 >> 2) + 1;
                      if (local_460 < 0x3fffc) {
                        local_480.type = SPV_OPERAND_TYPE_LITERAL_STRING;
                        bVar7 = true;
                        inst_offset = local_4a0;
                        local_480.num_words = uVar29;
                        if (local_494 == OpExtInstImport) {
                          sVar11 = spvExtInstImportTypeGet((char *)local_468);
                          if (sVar11 == SPV_EXT_INST_TYPE_NONE) {
                            anon_unknown.dwarf_620068::Parser::diagnostic
                                      (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,
                                       "Invalid extended instruction import \'",0x25);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,(char *)local_468,local_460);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,"\'",1);
                            goto LAB_00208730;
                          }
                          if (local_438._4_4_ == (anon_struct_4_0_00000001_for___align)0x0) {
                            __assert_fail("inst->result_id",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                          ,0x276,
                                          "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                         );
                          }
                          pmVar17 = std::__detail::
                                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&local_310,(key_type *)((long)&local_438 + 4));
                          *pmVar17 = sVar11;
                          inst_offset = local_4a0;
                        }
                      }
                      else {
                        anon_unknown.dwarf_620068::Parser::diagnostic
                                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Literal string is longer than ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," words: ",8);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," words long",0xb);
LAB_00208730:
                        sVar9 = local_208.error_;
                        spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                        bVar7 = false;
                        inst_offset = local_4a0;
                      }
                    }
                    if (local_468 != (spv_ext_inst_desc)local_458) {
                      operator_delete(local_468,CONCAT71(local_458._1_7_,local_458[0]) + 1);
                    }
                    if (bVar7) goto LAB_00208423;
                    break;
                  case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
                    sVar10 = spvtools::AssemblyGrammar::lookupOperand
                                       ((AssemblyGrammar *)local_3f0,sVar10,opcode,
                                        (spv_operand_desc *)&local_468);
                    if (sVar10 != SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_408 = spvOperandTypeStr(local_480.type);
                      pDVar14 = spvtools::DiagnosticStream::operator<<(&local_208,&local_408);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar14," operand: ",10);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar14,
                                 ", if you are creating a new source language please use value 0 (Unknown) and when ready, add your source language to SPIRV-Headers"
                                 ,0x82);
LAB_00207bd0:
                      inst_offset = local_4a0;
                      sVar9 = pDVar14->error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      goto joined_r0x0020841d;
                    }
                    goto LAB_00208404;
                  case SPV_OPERAND_TYPE_EXECUTION_MODEL:
                  case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
                  case SPV_OPERAND_TYPE_MEMORY_MODEL:
                  case SPV_OPERAND_TYPE_EXECUTION_MODE:
                  case SPV_OPERAND_TYPE_STORAGE_CLASS:
                  case SPV_OPERAND_TYPE_DIMENSIONALITY:
                  case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
                  case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
                  case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
                  case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
                  case SPV_OPERAND_TYPE_LINKAGE_TYPE:
                  case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
                  case SPV_OPERAND_TYPE_DECORATION:
                  case SPV_OPERAND_TYPE_BUILT_IN:
                  case SPV_OPERAND_TYPE_GROUP_OPERATION:
                  case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
                  case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
                  case SPV_OPERAND_TYPE_CAPABILITY:
                  case SPV_OPERAND_TYPE_FPENCODING:
                  case SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_OPTIONAL_FPENCODING:
                  case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                  case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
                  case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
                  case SPV_OPERAND_TYPE_DEBUG_OPERATION:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
                  case SPV_OPERAND_TYPE_FPDENORM_MODE:
                  case SPV_OPERAND_TYPE_FPOPERATION_MODE:
                  case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
                  case SPV_OPERAND_TYPE_OVERFLOW_MODES:
                  case SPV_OPERAND_TYPE_RAY_FLAGS:
                  case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
                  case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
                  case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
                  case SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT:
                  case SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT:
                  case SPV_OPERAND_TYPE_LOAD_CACHE_CONTROL:
                  case SPV_OPERAND_TYPE_STORE_CACHE_CONTROL:
                  case SPV_OPERAND_TYPE_NAMED_MAXIMUM_NUMBER_OF_REGISTERS:
                    if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT) {
                      local_480.type = SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT;
LAB_00207b33:
                      if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_FPENCODING) {
                        local_480.type = SPV_OPERAND_TYPE_FPENCODING;
                      }
                    }
                    else {
                      if (sVar10 != SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER) goto LAB_00207b33;
                      local_480.type = SPV_OPERAND_TYPE_ACCESS_QUALIFIER;
                    }
                    sVar10 = spvtools::AssemblyGrammar::lookupOperand
                                       ((AssemblyGrammar *)local_3f0,sVar10,opcode,
                                        (spv_operand_desc *)&local_468);
                    if (sVar10 != SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_620068::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_408 = spvOperandTypeStr(local_480.type);
                      pDVar14 = spvtools::DiagnosticStream::operator<<(&local_208,&local_408);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar14," operand: ",10);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                      goto LAB_00207bd0;
                    }
LAB_00208404:
                    spvPushOperandTypes(local_468->operandTypes + 4,&local_2a8);
                    sVar9 = opcode;
joined_r0x0020841d:
                    if (sVar10 == SPV_OPERAND_TYPE_NONE) goto LAB_00208423;
                    break;
                  default:
                    anon_unknown.dwarf_620068::Parser::diagnostic
                              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Internal error: Unhandled operand type: ",0x28
                              );
                    std::ostream::operator<<(&local_208,sVar10);
                    sVar9 = local_208.error_;
LAB_002087cb:
                    inst_offset = local_4a0;
                    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    break;
                  case SPV_OPERAND_TYPE_IMAGE:
                  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
                  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
                  case SPV_OPERAND_TYPE_LOOP_CONTROL:
                  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
                  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
                  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
                  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
                    if ((int)sVar10 < 0x4e) {
                      if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_IMAGE) {
                        local_480.type = SPV_OPERAND_TYPE_IMAGE;
                      }
                      else if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS) {
                        local_480.type = SPV_OPERAND_TYPE_MEMORY_ACCESS;
                      }
                    }
                    else if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS) {
                      local_480.type = SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS;
                    }
                    else if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS) {
                      local_480.type = SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS;
                    }
                    bVar7 = opcode == SPV_OPERAND_TYPE_NONE;
                    if (!bVar7) {
                      local_3f8 = (uint *)(ulong)opcode;
                      sVar10 = ~SPV_FORCE_32BIT_spv_operand_type_t;
                      do {
                        if ((sVar10 & opcode) != SPV_OPERAND_TYPE_NONE) {
                          sVar8 = spvtools::AssemblyGrammar::lookupOperand
                                            ((AssemblyGrammar *)local_3f0,
                                             (spv_operand_type_t)local_470,sVar10,
                                             (spv_operand_desc *)&local_468);
                          if (sVar8 == SPV_SUCCESS) {
                            opcode = opcode ^ sVar10;
                            spvPushOperandTypes(local_468->operandTypes + 4,&local_2a8);
                          }
                          else {
                            anon_unknown.dwarf_620068::Parser::diagnostic
                                      (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,"Invalid ",8);
                            local_408 = spvOperandTypeStr(local_480.type);
                            pDVar14 = spvtools::DiagnosticStream::operator<<(&local_208,&local_408);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar14," operand: ",10);
                            std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar14," has invalid mask component ",0x1c);
                            std::ostream::_M_insert<unsigned_long>((ulong)pDVar14);
                            user_data = (void *)(ulong)(uint)pDVar14->error_;
                            parsed_instruction = (spv_parsed_instruction_fn_t)(ulong)local_484;
                            spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                          }
                          sVar9 = (spv_operand_type_t)user_data;
                          if (sVar8 != SPV_SUCCESS) break;
                        }
                        sVar9 = (spv_operand_type_t)user_data;
                        sVar10 = sVar10 >> 1;
                        bVar7 = opcode == SPV_OPERAND_TYPE_NONE;
                      } while (!bVar7);
                    }
                    inst_offset = local_4a0;
                    if (bVar7) {
                      if (((uint)local_490 == 0) &&
                         (sVar8 = spvtools::AssemblyGrammar::lookupOperand
                                            ((AssemblyGrammar *)local_3f0,
                                             (spv_operand_type_t)local_470,0,
                                             (spv_operand_desc *)&local_208), sVar8 == SPV_SUCCESS))
                      {
                        spvPushOperandTypes((spv_operand_type_t *)
                                            (CONCAT44(local_208._4_4_,local_208._0_4_) + 0x28),
                                            &local_2a8);
                      }
                      goto LAB_00208423;
                    }
                  }
                  bVar7 = sVar9 == SPV_OPERAND_TYPE_NONE;
                  sVar10 = (spv_operand_type_t)local_418;
                  if (!bVar7) {
                    sVar10 = sVar9;
                  }
LAB_00208554:
                  user_data = (void *)(ulong)sVar10;
                } while (bVar7);
              }
              goto LAB_00207999;
            }
            sVar9 = SPV_OPERAND_TYPE_NONE;
            if (local_3f0._88_8_ != local_3f0._72_8_) {
              __assert_fail("_.word_index == _.num_words",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                            ,0x120,"spv_result_t (anonymous namespace)::Parser::parseModule()");
            }
            goto LAB_002076d4;
          }
          sVar9 = (*(code *)local_3f0._48_8_)
                            ((void *)local_3f0._40_8_,local_3f0._104_4_,local_238.magic,
                             local_238.version,local_238.generator,local_238.bound,local_238.schema)
          ;
          parsed_instruction = (spv_parsed_instruction_fn_t)(ulong)sVar9;
          if (sVar9 == SPV_OPERAND_TYPE_NONE) goto LAB_002077f1;
          goto LAB_002076d4;
        }
        anon_unknown.dwarf_620068::Parser::diagnostic
                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INTERNAL);
        pcVar33 = "Internal error: unhandled header parse failure";
        lVar25 = 0x2e;
      }
      else {
        anon_unknown.dwarf_620068::Parser::diagnostic
                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Invalid SPIR-V magic number \'",0x1d);
        lVar25 = *(long *)(CONCAT44(local_208._4_4_,local_208._0_4_) + -0x18);
        *(uint *)(&local_208.field_0x18 + lVar25) =
             *(uint *)(&local_208.field_0x18 + lVar25) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        pcVar33 = "\'.";
        lVar25 = 2;
      }
      goto LAB_00207648;
    }
    anon_unknown.dwarf_620068::Parser::diagnostic
              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Module has incomplete header: only ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208," words instead of ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
  }
  spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
  sVar9 = local_208.error_;
LAB_002076d4:
  anon_unknown.dwarf_620068::Parser::State::State
            ((State *)&local_208,(uint32_t *)0x0,0,(spv_diagnostic *)0x0);
  anon_unknown.dwarf_620068::Parser::State::operator=
            ((State *)(local_3f0 + 0x40),(State *)&local_208);
  anon_unknown.dwarf_620068::Parser::State::~State((State *)&local_208);
  anon_unknown.dwarf_620068::Parser::State::~State((State *)(local_3f0 + 0x40));
  if (local_278.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_278.consumer.super__Function_base._M_manager)
              ((_Any_data *)&local_278.consumer,(_Any_data *)&local_278.consumer,__destroy_functor);
  }
  return sVar9;
LAB_00208ef4:
  do {
    p_Var5 = (__node_ptr)((_Hash_node_base *)&(_Var24._M_nxt)->_M_nxt)->_M_nxt;
    uVar28 = (ulong)(uint)(((_Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                             *)(_Var24._M_nxt + 1))->
                          super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                          )._M_storage._M_storage.__align % __n;
    if (__s[uVar28] == (_Hash_node_base *)0x0) {
      ((_Hash_node_base *)&(_Var24._M_nxt)->_M_nxt)->_M_nxt = local_348._M_before_begin._M_nxt;
      __s[uVar28] = &local_348._M_before_begin;
      local_348._M_before_begin._M_nxt = _Var24._M_nxt;
      if (((_Hash_node_base *)&(_Var24._M_nxt)->_M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
        pp_Var22 = __s + uVar27;
        goto LAB_00208f4a;
      }
    }
    else {
      ((_Hash_node_base *)&(_Var24._M_nxt)->_M_nxt)->_M_nxt = __s[uVar28]->_M_nxt;
      pp_Var22 = &__s[uVar28]->_M_nxt;
      uVar28 = uVar27;
LAB_00208f4a:
      *pp_Var22 = _Var24._M_nxt;
    }
    _Var24._M_nxt = (_Hash_node_base *)p_Var5;
    uVar27 = uVar28;
  } while (p_Var5 != (__node_ptr)0x0);
LAB_00208f58:
  if (&local_348._M_single_bucket != local_348._M_buckets) {
    operator_delete(local_348._M_buckets,local_348._M_bucket_count << 3);
  }
  uVar27 = uVar26 % __n;
  uVar13 = (uint32_t)local_470;
  local_348._M_buckets = __s;
  local_348._M_bucket_count = __n;
LAB_00208f9d:
  if (local_348._M_buckets[uVar27] == (_Hash_node_base *)0x0) {
    (p_Var21->super__Hash_node_base)._M_nxt = local_348._M_before_begin._M_nxt;
    if ((__node_ptr)local_348._M_before_begin._M_nxt != (__node_ptr)0x0) {
      local_348._M_buckets
      [(ulong)(uint)(((_Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                       *)(local_348._M_before_begin._M_nxt + 1))->
                    super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                    )._M_storage._M_storage.__align % local_348._M_bucket_count] =
           (__node_base_ptr)p_Var21;
    }
    local_348._M_buckets[uVar27] = &local_348._M_before_begin;
    local_348._M_before_begin._M_nxt = (_Hash_node_base *)p_Var21;
  }
  else {
    (p_Var21->super__Hash_node_base)._M_nxt = local_348._M_buckets[uVar27]->_M_nxt;
    local_348._M_buckets[uVar27]->_M_nxt = (_Hash_node_base *)p_Var21;
  }
  local_348._M_element_count = local_348._M_element_count + 1;
LAB_0020901a:
  parsed_instruction = (spv_parsed_instruction_fn_t)(ulong)local_484;
  *(int *)((long)&(p_Var21->
                  super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                  ).
                  super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                  ._M_storage._M_storage + 4) = iVar31;
  *(uint32_t *)
   ((long)&(p_Var21->
           super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
           ).
           super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
           ._M_storage._M_storage + 8) = uVar13;
  inst_offset = local_4a0;
LAB_0020902e:
  local_458._16_8_ =
       local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((bool)local_3f0[0x6c] == false) {
    local_458._16_8_ = (Capability *)(local_3f0._64_8_ + inst_offset * 4);
  }
  sVar9 = (spv_operand_type_t)local_418;
  uStack_440 = local_4a2;
  psStack_430 = local_2d8;
  local_428[0]._0_2_ = (short)((uint)((int)local_2d0._M_current - (int)local_2d8) >> 4);
  if ((spv_parsed_instruction_fn_t)local_3f0._56_8_ != (spv_parsed_instruction_fn_t)0x0) {
    sVar10 = (*(code *)local_3f0._56_8_)
                       ((void *)local_3f0._40_8_,(spv_parsed_instruction_t *)(local_458 + 0x10));
    if (sVar10 != SPV_OPERAND_TYPE_NONE) {
      sVar9 = sVar10;
    }
    user_data = (void *)(ulong)sVar9;
    if (sVar10 != SPV_OPERAND_TYPE_NONE) goto LAB_00207999;
  }
  user_data = (spv_parsed_instruction_fn_t)0x0;
LAB_00207999:
  bVar7 = (int)user_data != 0;
  parsed_instruction = (spv_parsed_instruction_fn_t)((ulong)parsed_instruction & 0xffffffff);
  if (bVar7) {
    parsed_instruction = (spv_parsed_instruction_fn_t)user_data;
  }
  sVar9 = (spv_operand_type_t)parsed_instruction;
  if (bVar7) goto LAB_002076d4;
  goto LAB_00207811;
}

Assistant:

spv_result_t spvBinaryParse(const spv_const_context context, void* user_data,
                            const uint32_t* code, const size_t num_words,
                            spv_parsed_header_fn_t parsed_header,
                            spv_parsed_instruction_fn_t parsed_instruction,
                            spv_diagnostic* diagnostic) {
  spv_context_t hijack_context = *context;
  if (diagnostic) {
    *diagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, diagnostic);
  }
  Parser parser(&hijack_context, user_data, parsed_header, parsed_instruction);
  return parser.parse(code, num_words, diagnostic);
}